

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

bool __thiscall wasm::WATParser::Lexer::takeLParen(Lexer *this)

{
  pointer pAVar1;
  size_t sVar2;
  string_view sv;
  LexCtx local_30;
  
  local_30.input = next(this);
  local_30.lexedSize = 0;
  sv._M_str = "(";
  sv._M_len = 1;
  sVar2 = anon_unknown_0::LexCtx::startsWith(&local_30,sv);
  if (sVar2 != 0) {
    this->pos = this->pos + 1;
    pAVar1 = (this->annotations).
             super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->annotations).
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_finish != pAVar1) {
      (this->annotations).
      super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
      _M_impl.super__Vector_impl_data._M_finish = pAVar1;
    }
    skipSpace(this);
  }
  return (bool)(char)sVar2;
}

Assistant:

bool Lexer::takeLParen() {
  if (LexCtx(next()).startsWith("("sv)) {
    ++pos;
    advance();
    return true;
  }
  return false;
}